

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O2

bool __thiscall cmMessenger::GetSuppressDevWarnings(cmMessenger *this)

{
  cmState *this_00;
  bool bVar1;
  char *val;
  allocator local_31;
  string local_30;
  
  this_00 = this->State;
  std::__cxx11::string::string((string *)&local_30,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_31);
  val = cmState::GetCacheEntryValue(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  bVar1 = cmSystemTools::IsOn(val);
  return bVar1;
}

Assistant:

bool cmMessenger::GetSuppressDevWarnings() const
{
  const char* cacheEntryValue =
    this->State->GetCacheEntryValue("CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
  return cmSystemTools::IsOn(cacheEntryValue);
}